

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6_Apu.cpp
# Opt level: O2

void __thiscall Nes_Vrc6_Apu::run_saw(Nes_Vrc6_Apu *this,blip_time_t end_time)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  Blip_Buffer *buf;
  int iVar4;
  int delta;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  buf = this->oscs[2].output;
  if (buf != (Blip_Buffer *)0x0) {
    buf->modified_ = 1;
    iVar4 = this->oscs[2].last_amp;
    uVar6 = this->oscs[2].amp;
    iVar5 = this->last_time;
    bVar1 = this->oscs[2].regs[2];
    if (((char)bVar1 < '\0') && (bVar2 = this->oscs[2].regs[0], uVar6 != 0 || (bVar2 & 0x3f) != 0))
    {
      iVar5 = iVar5 + this->oscs[2].delay;
      if (iVar5 < end_time) {
        bVar3 = this->oscs[2].regs[1];
        iVar7 = this->oscs[2].phase;
        do {
          iVar7 = iVar7 + -1;
          if (iVar7 == 0) {
            uVar6 = 0;
            iVar7 = 7;
          }
          delta = ((int)uVar6 >> 3) - iVar4;
          if (delta != 0) {
            Blip_Synth<8,_1>::offset(&this->saw_synth,iVar5,delta,buf);
            iVar4 = (int)uVar6 >> 3;
          }
          uVar6 = uVar6 + (bVar2 & 0x3f) & 0xff;
          iVar5 = iVar5 + (bVar1 & 0xf) * 0x200 + (uint)bVar3 * 2 + 2;
        } while (iVar5 < end_time);
        this->oscs[2].phase = iVar7;
        this->oscs[2].amp = uVar6;
      }
      this->oscs[2].delay = iVar5 - end_time;
      iVar7 = iVar4;
    }
    else {
      this->oscs[2].delay = 0;
      iVar7 = (int)uVar6 >> 3;
      Blip_Synth<8,_1>::offset(&this->saw_synth,iVar5,iVar7 - iVar4,buf);
    }
    this->oscs[2].last_amp = iVar7;
  }
  return;
}

Assistant:

void Nes_Vrc6_Apu::run_saw( blip_time_t end_time )
{
	Vrc6_Osc& osc = oscs [2];
	Blip_Buffer* output = osc.output;
	if ( !output )
		return;
	output->set_modified();
	
	int amp = osc.amp;
	int amp_step = osc.regs [0] & 0x3F;
	blip_time_t time = last_time;
	int last_amp = osc.last_amp;
	if ( !(osc.regs [2] & 0x80) || !(amp_step | amp) )
	{
		osc.delay = 0;
		int delta = (amp >> 3) - last_amp;
		last_amp = amp >> 3;
		saw_synth.offset( time, delta, output );
	}
	else
	{
		time += osc.delay;
		if ( time < end_time )
		{
			int period = osc.period() * 2;
			int phase = osc.phase;
			
			do
			{
				if ( --phase == 0 )
				{
					phase = 7;
					amp = 0;
				}
				
				int delta = (amp >> 3) - last_amp;
				if ( delta )
				{
					last_amp = amp >> 3;
					saw_synth.offset( time, delta, output );
				}
				
				time += period;
				amp = (amp + amp_step) & 0xFF;
			}
			while ( time < end_time );
			
			osc.phase = phase;
			osc.amp = amp;
		}
		
		osc.delay = time - end_time;
	}
	
	osc.last_amp = last_amp;
}